

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Fts5Data * fts5DataRead(Fts5Index *p,i64 iRowid)

{
  sqlite3_blob **ppBlob;
  sqlite3_blob *psVar1;
  int iVar2;
  int iVar3;
  Incrblob *p_1;
  Fts5Data *p_00;
  sqlite3_blob *pBlob;
  
  if (p->rc != 0) {
    return (Fts5Data *)0x0;
  }
  ppBlob = &p->pReader;
  psVar1 = p->pReader;
  iVar3 = 0;
  if (psVar1 != (sqlite3_blob *)0x0) {
    *ppBlob = (sqlite3_blob *)0x0;
    iVar2 = sqlite3_blob_reopen(psVar1,iRowid);
    *ppBlob = psVar1;
    if (iVar2 != 0) {
      p->pReader = (sqlite3_blob *)0x0;
      iVar3 = sqlite3_blob_close(psVar1);
      if (p->rc == 0) {
        p->rc = iVar3;
      }
    }
    iVar3 = 0;
    if (iVar2 != 4) {
      iVar3 = iVar2;
    }
  }
  if ((iVar3 == 0) && (*ppBlob == (sqlite3_blob *)0x0)) {
    iVar3 = sqlite3_blob_open(p->pConfig->db,p->pConfig->zDb,p->zDataTbl,"block",iRowid,0,ppBlob);
  }
  iVar2 = 0x10b;
  if (iVar3 != 1) {
    iVar2 = iVar3;
  }
  if (iVar2 == 0) {
    psVar1 = *ppBlob;
    iVar3 = 0;
    if ((psVar1 != (sqlite3_blob *)0x0) && (iVar3 = 0, *(long *)(psVar1 + 0x18) != 0)) {
      iVar3 = *(int *)psVar1;
    }
    iVar2 = sqlite3_initialize();
    if (iVar2 == 0) {
      p_00 = (Fts5Data *)sqlite3Malloc((long)(iVar3 + 0x24));
    }
    else {
      p_00 = (Fts5Data *)0x0;
    }
    if (p_00 == (Fts5Data *)0x0) {
      iVar2 = 7;
    }
    else {
      p_00->nn = iVar3;
      p_00->p = (u8 *)(p_00 + 1);
      iVar2 = blobReadWrite(*ppBlob,p_00 + 1,iVar3,0,sqlite3BtreePayloadChecked);
    }
    if (iVar2 == 0) {
      p_00->p[iVar3] = '\0';
      p_00->p[(long)iVar3 + 1] = '\0';
      p_00->szLeaf = (uint)(ushort)(*(ushort *)(p_00->p + 2) << 8 | *(ushort *)(p_00->p + 2) >> 8);
      goto LAB_001e28cd;
    }
    sqlite3_free(p_00);
  }
  p_00 = (Fts5Data *)0x0;
LAB_001e28cd:
  p->rc = iVar2;
  p->nRead = p->nRead + 1;
  return p_00;
}

Assistant:

static Fts5Data *fts5DataRead(Fts5Index *p, i64 iRowid){
  Fts5Data *pRet = 0;
  if( p->rc==SQLITE_OK ){
    int rc = SQLITE_OK;

    if( p->pReader ){
      /* This call may return SQLITE_ABORT if there has been a savepoint
      ** rollback since it was last used. In this case a new blob handle
      ** is required.  */
      sqlite3_blob *pBlob = p->pReader;
      p->pReader = 0;
      rc = sqlite3_blob_reopen(pBlob, iRowid);
      assert( p->pReader==0 );
      p->pReader = pBlob;
      if( rc!=SQLITE_OK ){
        fts5IndexCloseReader(p);
      }
      if( rc==SQLITE_ABORT ) rc = SQLITE_OK;
    }

    /* If the blob handle is not open at this point, open it and seek
    ** to the requested entry.  */
    if( p->pReader==0 && rc==SQLITE_OK ){
      Fts5Config *pConfig = p->pConfig;
      rc = sqlite3_blob_open(pConfig->db,
          pConfig->zDb, p->zDataTbl, "block", iRowid, 0, &p->pReader
      );
    }

    /* If either of the sqlite3_blob_open() or sqlite3_blob_reopen() calls
    ** above returned SQLITE_ERROR, return SQLITE_CORRUPT_VTAB instead.
    ** All the reasons those functions might return SQLITE_ERROR - missing
    ** table, missing row, non-blob/text in block column - indicate
    ** backing store corruption.  */
    if( rc==SQLITE_ERROR ) rc = FTS5_CORRUPT;

    if( rc==SQLITE_OK ){
      u8 *aOut = 0;               /* Read blob data into this buffer */
      int nByte = sqlite3_blob_bytes(p->pReader);
      int szData = (sizeof(Fts5Data) + 7) & ~7;
      sqlite3_int64 nAlloc = szData + nByte + FTS5_DATA_PADDING;
      pRet = (Fts5Data*)sqlite3_malloc64(nAlloc);
      if( pRet ){
        pRet->nn = nByte;
        aOut = pRet->p = (u8*)pRet + szData;
      }else{
        rc = SQLITE_NOMEM;
      }

      if( rc==SQLITE_OK ){
        rc = sqlite3_blob_read(p->pReader, aOut, nByte, 0);
      }
      if( rc!=SQLITE_OK ){
        sqlite3_free(pRet);
        pRet = 0;
      }else{
        /* TODO1: Fix this */
        pRet->p[nByte] = 0x00;
        pRet->p[nByte+1] = 0x00;
        pRet->szLeaf = fts5GetU16(&pRet->p[2]);
      }
    }
    p->rc = rc;
    p->nRead++;
  }

  assert( (pRet==0)==(p->rc!=SQLITE_OK) );
  assert( pRet==0 || EIGHT_BYTE_ALIGNMENT( pRet->p ) );
  return pRet;
}